

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

void huelang::InitializeCore(Environment *env)

{
  Definition *pDVar1;
  unsigned_short *puVar2;
  Word WVar3;
  Word WVar4;
  Word WVar5;
  Word WVar6;
  Word WVar7;
  Word word;
  Word word_00;
  Word word_01;
  Word word_02;
  Word word_03;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"primary","");
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_50);
  WVar4.minor = WVar3.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  WVar4._4_4_ = 0;
  WVar4._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,WVar4,__primary);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"__intstate","");
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_70);
  WVar5.minor = WVar3.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  WVar5._4_4_ = 0;
  WVar5._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,WVar5,__instate_flag);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"__wordcomprehension","");
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_90);
  word.minor = WVar3.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  word._4_4_ = 0;
  word._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,word,__word_comprehension);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"__undefinedfinal","");
  WVar4 = DefinitionTable::TokToWord(&env->definitionTable,&local_b0);
  word_00.minor = WVar4.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  word_00._4_4_ = 0;
  word_00._0_4_ = WVar4._0_4_;
  Environment::AddPrimaryDefinition(env,word_00,__undefined_final);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"composite","");
  WVar5 = DefinitionTable::TokToWord(&env->definitionTable,&local_d0);
  word_01.minor = WVar5.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  word_01._4_4_ = 0;
  word_01._0_4_ = WVar5._0_4_;
  Environment::AddPrimaryDefinition(env,word_01,__composite);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"inaction","");
  WVar6 = DefinitionTable::TokToWord(&env->definitionTable,&local_f0);
  word_02.minor = WVar6.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  word_02._4_4_ = 0;
  word_02._0_4_ = WVar6._0_4_;
  Environment::AddPrimaryDefinition(env,word_02,__inaction);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"preeval","");
  WVar7 = DefinitionTable::TokToWord(&env->definitionTable,&local_110);
  word_03.minor = WVar7.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  word_03._4_4_ = 0;
  word_03._0_4_ = WVar7._0_4_;
  pDVar1 = DefinitionTable::operator[](&env->definitionTable,word_03);
  (pDVar1->type).major = WVar6.major;
  (pDVar1->type).minor = word_02.minor;
  (pDVar1->value).pointer = (void *)0x0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"undefined","");
  WVar6 = DefinitionTable::TokToWord(&env->definitionTable,&local_130);
  WVar7.minor = WVar6.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  puVar2 = (unsigned_short *)operator_new(0x20);
  puVar2[0] = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = 0;
  *puVar2 = WVar3.major;
  *(unsigned_long *)(puVar2 + 4) = word.minor;
  puVar2[8] = WVar4.major;
  *(unsigned_long *)(puVar2 + 0xc) = word_00.minor;
  WVar7._4_4_ = 0;
  WVar7._0_4_ = WVar6._0_4_;
  pDVar1 = DefinitionTable::operator[](&env->definitionTable,WVar7);
  (pDVar1->type).major = WVar5.major;
  (pDVar1->type).minor = word_01.minor;
  (pDVar1->value).pointer = puVar2;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"use","");
  WVar3 = DefinitionTable::TokToWord(&env->definitionTable,&local_150);
  WVar6.minor = WVar3.minor;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  WVar6._4_4_ = 0;
  WVar6._0_4_ = WVar3._0_4_;
  Environment::AddPrimaryDefinition(env,WVar6,__use);
  return;
}

Assistant:

void InitializeCore(Environment& env) {
        //Word wordword = env.definitionTable.TokToWord(WORDWORD);

        Word primaryword = env.definitionTable.TokToWord(PRIMARYDEFINITIONWORD);
        env.AddPrimaryDefinition(primaryword, &__primary);

        Word intflagword = env.definitionTable.TokToWord(INTSTATEFLAG);
        env.AddPrimaryDefinition(intflagword, &__instate_flag);

        Word wordcompword 
            = env.definitionTable.TokToWord(WORDCOMPREHENSIONWORD);
        env.AddPrimaryDefinition(wordcompword, &__word_comprehension);

        Word undefinedfinalword
            = env.definitionTable.TokToWord(UNDEFINEDFINALWORD);
        env.AddPrimaryDefinition(undefinedfinalword, &__undefined_final);

        Word compositeword = env.definitionTable.TokToWord(COMPOSITEWORD);
        env.AddPrimaryDefinition(compositeword, &__composite);

        Word inactionword = env.definitionTable.TokToWord(INACTIONWORD);
        env.AddPrimaryDefinition(inactionword, &__inaction);

        Word preevalword = env.definitionTable.TokToWord(PREEVALWORD);
        Definition& preevaldefinition = env.definitionTable[preevalword];
        preevaldefinition.type = inactionword;
        preevaldefinition.value.number = 0;

        Word undefinedword = env.definitionTable.TokToWord(UNDEFINEDWORD);
        CompositeDefinition *undefinedworddefptr = new CompositeDefinition();
        undefinedworddefptr->f = wordcompword;
        undefinedworddefptr->g = undefinedfinalword;
        Definition& undefineddefinition 
            = env.definitionTable[undefinedword];
        undefineddefinition.type = compositeword;
        undefineddefinition.value.pointer = undefinedworddefptr;

        Word useword = env.definitionTable.TokToWord(USEWORD);
        env.AddPrimaryDefinition(useword, __use);
    }